

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9250::IMURead(RTIMUMPU9250 *this)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  RTFLOAT RVar5;
  RTFLOAT val;
  uint local_38;
  float temp;
  int blockCount;
  uchar compassData [8];
  uchar fifoData [12];
  uint count;
  uchar fifoCount [2];
  RTIMUMPU9250 *this_local;
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'r',
                            '\x02',fifoData + 10,"Failed to read fifo count");
  if (bVar1) {
    fifoData._4_4_ = (uint)fifoData[10] * 0x100 + (uint)fifoData[0xb];
    if (fifoData._4_4_ == 0x200) {
      printf("%s","MPU-9250 fifo has overflowed");
      fflush(_stdout);
      resetFifo(this);
      (this->super_RTIMU).m_imuData.timestamp =
           (this->super_RTIMU).m_sampleInterval * 0x2b + (this->super_RTIMU).m_imuData.timestamp;
      this_local._7_1_ = false;
    }
    else {
      if (((this->m_cacheCount == 0) && (0xb < (uint)fifoData._4_4_)) &&
         ((uint)fifoData._4_4_ < 0xc0)) {
        bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'t','\f',compassData,"Failed to read fifo data")
        ;
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'I','\b',(uchar *)&temp,
                                  "Failed to read compass data");
        if (!bVar1) {
          return false;
        }
      }
      else {
        if (0xbf < (uint)fifoData._4_4_) {
          if (this->m_cacheCount == 0x10) {
            (this->super_RTIMU).m_imuData.timestamp =
                 (this->super_RTIMU).m_sampleInterval * (long)this->m_cache[this->m_cacheOut].count
                 + (this->super_RTIMU).m_imuData.timestamp;
            iVar2 = this->m_cacheOut + 1;
            this->m_cacheOut = iVar2;
            if (iVar2 == 0x10) {
              this->m_cacheOut = 0;
            }
            this->m_cacheCount = this->m_cacheCount + -1;
          }
          local_38 = (uint)fifoData._4_4_ / 0xc;
          if (0x10 < local_38) {
            local_38 = 0x10;
          }
          bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                    this->m_slaveAddr,'t',(char)local_38 * '\f',
                                    this->m_cache[this->m_cacheIn].data,"Failed to read fifo data");
          if (!bVar1) {
            return false;
          }
          bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                    this->m_slaveAddr,'I','\b',
                                    this->m_cache[this->m_cacheIn].compass,
                                    "Failed to read compass data");
          if (!bVar1) {
            return false;
          }
          this->m_cache[this->m_cacheIn].count = local_38;
          this->m_cache[this->m_cacheIn].index = 0;
          this->m_cacheCount = this->m_cacheCount + 1;
          iVar2 = this->m_cacheIn + 1;
          this->m_cacheIn = iVar2;
          if (iVar2 == 0x10) {
            this->m_cacheIn = 0;
          }
        }
        if (this->m_cacheCount == 0) {
          return false;
        }
        lVar4 = (long)this->m_cache[this->m_cacheOut].index;
        compassData = *(uchar (*) [8])(this->m_cache[this->m_cacheOut].data + lVar4);
        fifoData._0_4_ = *(undefined4 *)(this->m_cache[this->m_cacheOut].data + lVar4 + 8);
        _temp = *(undefined8 *)this->m_cache[this->m_cacheOut].compass;
        this->m_cache[this->m_cacheOut].index = this->m_cache[this->m_cacheOut].index + 0xc;
        iVar2 = this->m_cache[this->m_cacheOut].count + -1;
        this->m_cache[this->m_cacheOut].count = iVar2;
        if (iVar2 == 0) {
          iVar2 = this->m_cacheOut + 1;
          this->m_cacheOut = iVar2;
          if (iVar2 == 0x10) {
            this->m_cacheOut = 0;
          }
          this->m_cacheCount = this->m_cacheCount + -1;
        }
      }
      RTMath::convertToVector
                (compassData,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,true);
      RTMath::convertToVector
                (compassData + 6,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,true);
      RTMath::convertToVector
                ((uchar *)((long)&temp + 1),&(this->super_RTIMU).m_imuData.compass,0.6,false);
      RVar5 = RTVector3::x(&(this->super_RTIMU).m_imuData.gyro);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.gyro,RVar5);
      RVar5 = RTVector3::y(&(this->super_RTIMU).m_imuData.gyro);
      RTVector3::setY(&(this->super_RTIMU).m_imuData.gyro,-RVar5);
      RVar5 = RTVector3::z(&(this->super_RTIMU).m_imuData.gyro);
      RTVector3::setZ(&(this->super_RTIMU).m_imuData.gyro,-RVar5);
      RVar5 = RTVector3::x(&(this->super_RTIMU).m_imuData.accel);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.accel,-RVar5);
      RVar5 = RTVector3::x(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.compass,RVar5 * this->m_compassAdjust[0]);
      RVar5 = RTVector3::y(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setY(&(this->super_RTIMU).m_imuData.compass,RVar5 * this->m_compassAdjust[1]);
      RVar5 = RTVector3::z(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setZ(&(this->super_RTIMU).m_imuData.compass,RVar5 * this->m_compassAdjust[2]);
      RVar5 = RTVector3::x(&(this->super_RTIMU).m_imuData.compass);
      val = RTVector3::y(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.compass,val);
      RTVector3::setY(&(this->super_RTIMU).m_imuData.compass,-RVar5);
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      if ((this->m_firstTime & 1U) == 0) {
        (this->super_RTIMU).m_imuData.timestamp =
             (this->super_RTIMU).m_sampleInterval + (this->super_RTIMU).m_imuData.timestamp;
      }
      else {
        uVar3 = RTMath::currentUSecsSinceEpoch();
        (this->super_RTIMU).m_imuData.timestamp = uVar3;
      }
      this->m_firstTime = false;
      RTIMU::updateFusion(&this->super_RTIMU);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9250::IMURead()
{
    unsigned char fifoCount[2];
    unsigned int count;
    unsigned char fifoData[12];
    unsigned char compassData[8];

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_COUNT_H, 2, fifoCount, "Failed to read fifo count"))
         return false;

    count = ((unsigned int)fifoCount[0] << 8) + fifoCount[1];

    if (count == 512) {
        HAL_INFO("MPU-9250 fifo has overflowed");
        resetFifo();
        m_imuData.timestamp += m_sampleInterval * (512 / MPU9250_FIFO_CHUNK_SIZE + 1); // try to fix timestamp
        return false;
    }

#ifdef MPU9250_CACHE_MODE
    if ((m_cacheCount == 0) && (count  >= MPU9250_FIFO_CHUNK_SIZE) && (count < (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE))) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
            return false;

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
            return false;
    } else {
        if (count >= (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE)) {
            if (m_cacheCount == MPU9250_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            int blockCount = count / MPU9250_FIFO_CHUNK_SIZE;   // number of chunks in fifo

            if (blockCount > MPU9250_CACHE_SIZE)
                blockCount = MPU9250_CACHE_SIZE;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE * blockCount,
                    m_cache[m_cacheIn].data, "Failed to read fifo data"))
                return false;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, m_cache[m_cacheIn].compass, "Failed to read compass data"))
                return false;

            m_cache[m_cacheIn].count = blockCount;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(fifoData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, MPU9250_FIFO_CHUNK_SIZE);
        memcpy(compassData, m_cache[m_cacheOut].compass, 8);

        m_cache[m_cacheOut].index += MPU9250_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
    }

#else

    if (count > MPU9250_FIFO_CHUNK_SIZE * 40) {
        // more than 40 samples behind - going too slowly so discard some samples but maintain timestamp correctly
        while (count >= MPU9250_FIFO_CHUNK_SIZE * 10) {
            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
                return false;
            count -= MPU9250_FIFO_CHUNK_SIZE;
            m_imuData.timestamp += m_sampleInterval;
        }
    }

    if (count < MPU9250_FIFO_CHUNK_SIZE)
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
        return false;

#endif

    RTMath::convertToVector(fifoData, m_imuData.accel, m_accelScale, true);
    RTMath::convertToVector(fifoData + 6, m_imuData.gyro, m_gyroScale, true);
    RTMath::convertToVector(compassData + 1, m_imuData.compass, 0.6f, false);

    //  sort out gyro axes

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  use the compass fuse data adjustments

    m_imuData.compass.setX(m_imuData.compass.x() * m_compassAdjust[0]);
    m_imuData.compass.setY(m_imuData.compass.y() * m_compassAdjust[1]);
    m_imuData.compass.setZ(m_imuData.compass.z() * m_compassAdjust[2]);

    //  sort out compass axes

    float temp;

    temp = m_imuData.compass.x();
    m_imuData.compass.setX(m_imuData.compass.y());
    m_imuData.compass.setY(-temp);

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}